

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dto.h
# Opt level: O1

ostream * operator<<(ostream *os,Complex *m)

{
  size_t sVar1;
  ostream *poVar2;
  string local_58;
  long *local_38;
  undefined8 local_30;
  long local_28;
  undefined2 local_20;
  undefined1 local_1e;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Complex{cmd=\'",0xd);
  local_28 = *(long *)(m->header).cmd;
  local_20 = *(undefined2 *)((m->header).cmd + 8);
  local_30 = 10;
  local_1e = 0;
  local_38 = &local_28;
  sVar1 = strlen((char *)&local_28);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_28,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\', cmd_seq=",0xb);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", param=",8);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", payload=\'",0xb);
  dto::pretty_payload(&local_58,&m->payload);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'}",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_38 != &local_28) {
    operator_delete(local_38,local_28 + 1);
  }
  return poVar2;
}

Assistant:

inline std::ostream &operator<<(std::ostream &os, const dto::Complex &m) {
  return os << "Complex{cmd='" << std::string(m.header.cmd, dto::CMD_TYPE_LEN).c_str() << "', cmd_seq=" << m.header.cmd_seq
            << ", param=" << m.header.param
            << ", payload='"
            << dto::pretty_payload(m.payload) << "'}";
}